

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testScanLineApi.cpp
# Opt level: O0

void anon_unknown.dwarf_207011::writeRead
               (string *tempDir,Array2D<unsigned_int> *pi,Array2D<Imath_3_2::half> *ph,
               Array2D<float> *pf,int W,int H,LineOrder lorder,Compression comp,
               LevelRoundingMode rmode,int dx,int dy,int xSize,int ySize)

{
  string filename;
  undefined1 in_stack_00000fdf;
  int in_stack_00000fe0;
  LineOrder in_stack_00000fe4;
  char *in_stack_00000fe8;
  Array2D<float> *in_stack_00000ff0;
  Array2D<Imath_3_2::half> *in_stack_00000ff8;
  Array2D<unsigned_int> *in_stack_00001000;
  int in_stack_00001010;
  int in_stack_00001018;
  int in_stack_00001020;
  int in_stack_00001028;
  int in_stack_00001030;
  Compression in_stack_00001038;
  LevelMode in_stack_00001040;
  LevelRoundingMode in_stack_00001048;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  string local_70 [72];
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                 (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  std::__cxx11::string::c_str();
  writeRead(in_stack_00001000,in_stack_00000ff8,in_stack_00000ff0,in_stack_00000fe8,
            in_stack_00000fe4,in_stack_00000fe0,in_stack_00001010,in_stack_00001018,
            in_stack_00001020,in_stack_00001028,in_stack_00001030,in_stack_00001038,
            in_stack_00001040,in_stack_00001048,(bool)in_stack_00000fdf);
  std::__cxx11::string::c_str();
  writeRead(in_stack_00001000,in_stack_00000ff8,in_stack_00000ff0,in_stack_00000fe8,
            in_stack_00000fe4,in_stack_00000fe0,in_stack_00001010,in_stack_00001018,
            in_stack_00001020,in_stack_00001028,in_stack_00001030,in_stack_00001038,
            in_stack_00001040,in_stack_00001048,(bool)in_stack_00000fdf);
  std::__cxx11::string::c_str();
  writeRead(in_stack_00001000,in_stack_00000ff8,in_stack_00000ff0,in_stack_00000fe8,
            in_stack_00000fe4,in_stack_00000fe0,in_stack_00001010,in_stack_00001018,
            in_stack_00001020,in_stack_00001028,in_stack_00001030,in_stack_00001038,
            in_stack_00001040,in_stack_00001048,(bool)in_stack_00000fdf);
  std::__cxx11::string::c_str();
  writeRead(in_stack_00001000,in_stack_00000ff8,in_stack_00000ff0,in_stack_00000fe8,
            in_stack_00000fe4,in_stack_00000fe0,in_stack_00001010,in_stack_00001018,
            in_stack_00001020,in_stack_00001028,in_stack_00001030,in_stack_00001038,
            in_stack_00001040,in_stack_00001048,(bool)in_stack_00000fdf);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void
writeRead (
    const std::string&           tempDir,
    const Array2D<unsigned int>& pi,
    const Array2D<half>&         ph,
    const Array2D<float>&        pf,
    int                          W,
    int                          H,
    LineOrder                    lorder,
    Compression                  comp,
    LevelRoundingMode            rmode,
    int                          dx,
    int                          dy,
    int                          xSize,
    int                          ySize)
{
    std::string filename = tempDir + "imf_test_scanline_api.exr";

    writeRead (
        pi,
        ph,
        pf,
        filename.c_str (),
        lorder,
        W,
        H,
        xSize,
        ySize,
        dx,
        dy,
        comp,
        ONE_LEVEL,
        rmode,
        false);
    writeRead (
        pi,
        ph,
        pf,
        filename.c_str (),
        lorder,
        W,
        H,
        xSize,
        ySize,
        dx,
        dy,
        comp,
        MIPMAP_LEVELS,
        rmode,
        false);
    writeRead (
        pi,
        ph,
        pf,
        filename.c_str (),
        lorder,
        W,
        H,
        xSize,
        ySize,
        dx,
        dy,
        comp,
        RIPMAP_LEVELS,
        rmode,
        false);
    writeRead (
        pi,
        ph,
        pf,
        filename.c_str (),
        lorder,
        W,
        H,
        xSize,
        ySize,
        dx,
        dy,
        comp,
        ONE_LEVEL,
        rmode,
        true);
}